

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer_cast.cpp
# Opt level: O3

BoundCastInfo *
duckdb::DefaultCasts::PointerCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  pointer *__ptr;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_18;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_10;
  
  if (target->id_ == VARCHAR) {
    local_10._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::StringCast<unsigned_long,duckdb::CastFromPointer>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_10,(init_cast_local_state_t)0x0);
    _Var1._M_head_impl = local_10._M_head_impl;
  }
  else {
    local_18._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,(cast_function_t)0x0,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_18,(init_cast_local_state_t)0x0);
    _Var1._M_head_impl = local_18._M_head_impl;
  }
  if (_Var1._M_head_impl != (BoundCastData *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_BoundCastData[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::PointerCastSwitch(BindCastInput &input, const LogicalType &source,
                                              const LogicalType &target) {
	// now switch on the result type
	switch (target.id()) {
	case LogicalTypeId::VARCHAR:
		// pointer to varchar
		return BoundCastInfo(&VectorCastHelpers::StringCast<uintptr_t, duckdb::CastFromPointer>);
	default:
		return nullptr;
	}
}